

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O0

void __thiscall
KDReports::ReportBuilder::setTabPositions(ReportBuilder *this,QList<QTextOption::Tab> *tabs)

{
  bool bVar1;
  iterator o;
  Tab *pTVar2;
  qreal qVar3;
  Tab *tab;
  iterator __end1;
  iterator __begin1;
  QList<QTextOption::Tab> *__range1;
  QList<QTextOption::Tab> *tabs_local;
  ReportBuilder *this_local;
  
  QList<QTextOption::Tab>::operator=(&this->m_tabPositions,tabs);
  __end1 = QList<QTextOption::Tab>::begin(&this->m_tabPositions);
  o = QList<QTextOption::Tab>::end(&this->m_tabPositions);
  while( true ) {
    bVar1 = QList<QTextOption::Tab>::iterator::operator!=(&__end1,o);
    if (!bVar1) break;
    pTVar2 = QList<QTextOption::Tab>::iterator::operator*(&__end1);
    qVar3 = mmToPixels(pTVar2->position);
    pTVar2->position = qVar3;
    QList<QTextOption::Tab>::iterator::operator++(&__end1);
  }
  TextDocumentData::setUsesTabPositions(this->m_contentDocument,true);
  return;
}

Assistant:

void KDReports::ReportBuilder::setTabPositions(const QList<QTextOption::Tab> &tabs)
{
    m_tabPositions = tabs;
    for (QTextOption::Tab &tab : m_tabPositions) {
        tab.position = mmToPixels(tab.position);
    }
    m_contentDocument.setUsesTabPositions(true);
}